

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGjkEpa2.cpp
# Opt level: O3

btScalar gjkepa2_impl::GJK::projectorigin
                   (btVector3 *a,btVector3 *b,btVector3 *c,btVector3 *d,btScalar *w,U *m)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  btVector3 *b_00;
  btVector3 *a_00;
  btVector3 *b_01;
  long lVar4;
  ulong uVar5;
  long lVar6;
  byte bVar7;
  float fVar8;
  btScalar bVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  U subm;
  btScalar subw [3];
  btVector3 dl [3];
  btVector3 *vt [4];
  U local_d8;
  float local_d4;
  btScalar local_d0 [4];
  U *local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  btVector3 *local_a0;
  btVector3 *local_98;
  btVector3 *local_90;
  undefined1 local_88 [4];
  float afStack_84 [3];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  btVector3 *local_58 [5];
  
  local_58[0] = a;
  local_58[1] = b;
  local_58[2] = c;
  local_58[3] = d;
  fVar8 = (float)*(undefined8 *)a->m_floats;
  fVar10 = (float)((ulong)*(undefined8 *)a->m_floats >> 0x20);
  fVar20 = (float)*(undefined8 *)d->m_floats;
  fVar22 = fVar8 - fVar20;
  fVar21 = (float)((ulong)*(undefined8 *)d->m_floats >> 0x20);
  fVar23 = fVar10 - fVar21;
  fVar1 = a->m_floats[2];
  fVar19 = d->m_floats[2];
  fVar17 = fVar1 - fVar19;
  unique0x10000030 = fVar23;
  local_88 = fVar22;
  unique0x10000034 = fVar17;
  unique0x10000038 = 0;
  fVar11 = (float)*(undefined8 *)b->m_floats;
  fVar12 = (float)((ulong)*(undefined8 *)b->m_floats >> 0x20);
  fVar13 = fVar11 - fVar20;
  fVar14 = fVar12 - fVar21;
  fVar2 = b->m_floats[2];
  fVar18 = fVar2 - fVar19;
  local_78._4_4_ = fVar14;
  local_78._0_4_ = fVar13;
  local_78._8_4_ = fVar18;
  local_78._12_4_ = 0;
  fVar15 = (float)*(undefined8 *)c->m_floats;
  fVar16 = (float)((ulong)*(undefined8 *)c->m_floats >> 0x20);
  fVar20 = fVar15 - fVar20;
  fVar21 = fVar16 - fVar21;
  fVar19 = c->m_floats[2] - fVar19;
  local_68._4_4_ = fVar21;
  local_68._0_4_ = fVar20;
  local_68._8_4_ = fVar19;
  local_68._12_4_ = 0;
  fVar20 = (fVar22 * fVar14 * fVar19 +
           (((fVar23 * fVar18 * fVar20 + fVar17 * fVar13 * fVar21) - fVar18 * fVar22 * fVar21) -
           fVar13 * fVar23 * fVar19)) - fVar14 * fVar17 * fVar20;
  fVar19 = -1.0;
  if ((fVar20 != 0.0) &&
     (fVar15 = fVar11 - fVar15, fVar16 = fVar12 - fVar16, fVar21 = fVar2 - c->m_floats[2],
     (((fVar10 - fVar12) * fVar15 - (fVar8 - fVar11) * fVar16) * fVar1 +
     (fVar16 * (fVar1 - fVar2) - (fVar10 - fVar12) * fVar21) * fVar8 +
     (fVar21 * (fVar8 - fVar11) - (fVar1 - fVar2) * fVar15) * fVar10) * fVar20 <= 0.0)) {
    lVar6 = 0;
    local_d0[2] = 0.0;
    local_d0[0] = 0.0;
    local_d0[1] = 0.0;
    local_d8 = 0;
    fVar19 = -1.0;
    bVar7 = 0;
    local_b8 = CONCAT44(fVar23,fVar20);
    uStack_b0 = 0;
    local_c0 = m;
    local_a0 = c;
    local_98 = b;
    local_90 = a;
    do {
      uVar3 = *(uint *)((long)projectorigin::imd3 + lVar6);
      uVar5 = (ulong)uVar3;
      lVar4 = uVar5 * 0x10;
      if (0.0 < ((*(float *)(local_88 + lVar6 * 4) * *(float *)(local_88 + lVar4 + 4) -
                 *(float *)(local_88 + lVar4) * *(float *)(local_88 + lVar6 * 4 + 4)) *
                 d->m_floats[2] +
                (*(float *)(local_88 + lVar6 * 4 + 4) * *(float *)(local_88 + lVar4 + 8) -
                *(float *)(local_88 + lVar4 + 4) * *(float *)(local_88 + lVar6 * 4 + 8)) *
                d->m_floats[0] +
                (*(float *)(local_88 + lVar6 * 4 + 8) * *(float *)(local_88 + lVar4) -
                *(float *)(local_88 + lVar4 + 8) * *(float *)(local_88 + lVar6 * 4)) *
                d->m_floats[1]) * fVar20) {
        local_d4 = fVar19;
        bVar9 = projectorigin(*(btVector3 **)((long)local_58 + lVar6 * 2),local_58[uVar5],d,local_d0
                              ,&local_d8);
        fVar20 = (float)local_b8;
        if ((local_d4 < 0.0) || (fVar19 = local_d4, bVar9 < local_d4)) {
          *local_c0 = (1 << ((byte)uVar3 & 0x1f) & (int)(local_d8 << 0x1e) >> 0x1f) +
                      (local_d8 & 4) * 2 + (1 << (bVar7 & 0x1f) & -(local_d8 & 1));
          *(btScalar *)((long)w + lVar6) = local_d0[0];
          w[uVar5] = local_d0[1];
          w[projectorigin::imd3[uVar5]] = 0.0;
          w[3] = local_d0[2];
          fVar19 = bVar9;
        }
      }
      a_00 = local_98;
      b_00 = local_a0;
      bVar7 = bVar7 + 1;
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0xc);
    if (fVar19 < 0.0) {
      *local_c0 = 0xf;
      bVar9 = det(local_a0,local_98,d);
      b_01 = local_90;
      *w = bVar9 / (float)local_b8;
      bVar9 = det(local_90,b_00,d);
      w[1] = bVar9 / (float)local_b8;
      bVar9 = det(a_00,b_01,d);
      w[2] = bVar9 / (float)local_b8;
      w[3] = 1.0 - (*w + w[1] + bVar9 / (float)local_b8);
      fVar19 = 0.0;
    }
  }
  return fVar19;
}

Assistant:

static btScalar		projectorigin(	const btVector3& a,
				const btVector3& b,
				const btVector3& c,
				const btVector3& d,
				btScalar* w,U& m)
			{
				static const U		imd3[]={1,2,0};
				const btVector3*	vt[]={&a,&b,&c,&d};
				const btVector3		dl[]={a-d,b-d,c-d};
				const btScalar		vl=det(dl[0],dl[1],dl[2]);
				const bool			ng=(vl*btDot(a,btCross(b-c,a-b)))<=0;
				if(ng&&(btFabs(vl)>GJK_SIMPLEX4_EPS))
				{
					btScalar	mindist=-1;
					btScalar	subw[3]={0.f,0.f,0.f};
					U			subm(0);
					for(U i=0;i<3;++i)
					{
						const U			j=imd3[i];
						const btScalar	s=vl*btDot(d,btCross(dl[i],dl[j]));
						if(s>0)
						{
							const btScalar	subd=projectorigin(*vt[i],*vt[j],d,subw,subm);
							if((mindist<0)||(subd<mindist))
							{
								mindist		=	subd;
								m			=	static_cast<U>((subm&1?1<<i:0)+
									(subm&2?1<<j:0)+
									(subm&4?8:0));
								w[i]		=	subw[0];
								w[j]		=	subw[1];
								w[imd3[j]]	=	0;
								w[3]		=	subw[2];
							}
						}
					}
					if(mindist<0)
					{
						mindist	=	0;
						m		=	15;
						w[0]	=	det(c,b,d)/vl;
						w[1]	=	det(a,c,d)/vl;
						w[2]	=	det(b,a,d)/vl;
						w[3]	=	1-(w[0]+w[1]+w[2]);
					}
					return(mindist);
				}
				return(-1);
			}